

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditPrivate::positionSideWidgets(QLineEditPrivate *this)

{
  pointer pSVar1;
  char cVar2;
  SideWidgetEntryList *pSVar3;
  SideWidgetEntry *e_1;
  pointer pSVar4;
  SideWidgetEntry *e;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  SideWidgetParameters SVar8;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    QVar7 = QWidget::rect(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
    SVar8 = sideWidgetParameters(this);
    local_48.y1.m_i = ((QVar7.y2.m_i.m_i - (QVar7.y1.m_i.m_i + SVar8.widgetHeight)) + 1) / 2;
    local_48.y2.m_i = SVar8.widgetHeight + local_48.y1.m_i + -1;
    local_48.x1.m_i = SVar8.margin;
    iVar5 = local_48.x1.m_i + SVar8.widgetWidth;
    local_48.x2.m_i = local_48.x1.m_i + -1 + SVar8.widgetWidth;
    pSVar3 = leftSideWidgetList(this);
    pSVar1 = (pSVar3->
             super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar4 = (pSVar3->
                  super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1)
    {
      QWidget::setGeometry(pSVar4->widget,&local_48);
      cVar2 = QAction::isVisible();
      if (cVar2 != '\0') {
        local_48.x2.m_i = local_48.x2.m_i + iVar5;
        local_48.x1.m_i = local_48.x1.m_i + iVar5;
      }
    }
    iVar6 = (QVar7.x2.m_i.m_i - (QVar7.x1.m_i.m_i + iVar5)) + 1;
    local_48.x2.m_i = local_48.x2.m_i + (iVar6 - local_48.x1.m_i);
    local_48.x1.m_i = iVar6;
    pSVar3 = rightSideWidgetList(this);
    pSVar1 = (pSVar3->
             super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar4 = (pSVar3->
                  super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1)
    {
      QWidget::setGeometry(pSVar4->widget,&local_48);
      cVar2 = QAction::isVisible();
      if (cVar2 != '\0') {
        local_48.x2.m_i = local_48.x2.m_i - iVar5;
        local_48.x1.m_i = local_48.x1.m_i - iVar5;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::positionSideWidgets()
{
    Q_Q(QLineEdit);
    if (hasSideWidgets()) {
        const QRect contentRect = q->rect();
        const SideWidgetParameters p = sideWidgetParameters();
        const int delta = p.margin + p.widgetWidth;
        QRect widgetGeometry(QPoint(p.margin, (contentRect.height() - p.widgetHeight) / 2),
                             QSize(p.widgetWidth, p.widgetHeight));
        for (const SideWidgetEntry &e : leftSideWidgetList()) {
            e.widget->setGeometry(widgetGeometry);
#if QT_CONFIG(action)
            if (e.action->isVisible())
                widgetGeometry.moveLeft(widgetGeometry.left() + delta);
#else
            Q_UNUSED(delta);
#endif
        }
        widgetGeometry.moveLeft(contentRect.width() - p.widgetWidth - p.margin);
        for (const SideWidgetEntry &e : rightSideWidgetList()) {
            e.widget->setGeometry(widgetGeometry);
#if QT_CONFIG(action)
            if (e.action->isVisible())
                widgetGeometry.moveLeft(widgetGeometry.left() - delta);
#endif
        }
    }
}